

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O0

void av1_cyclic_refresh_update_parameters(AV1_COMP *cpi)

{
  AV1_PRIMARY *pAVar1;
  CYCLIC_REFRESH *pCVar2;
  int iVar3;
  int iVar4;
  AV1_COMP *in_RDI;
  bool bVar5;
  bool bVar6;
  double distance_from_sc_factor;
  int frames_since_scene_change;
  int is_screen_content;
  int scene_change_detected;
  int qp_max_thresh;
  int qp_thresh;
  SVC *svc;
  CYCLIC_REFRESH *cr;
  AV1_COMMON *cm;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  double local_78;
  double local_70;
  int local_5c;
  int local_58;
  int local_54;
  
  pAVar1 = in_RDI->ppi;
  pCVar2 = in_RDI->cyclic_refresh;
  if ((in_RDI->rc).best_quality + 4 < 0x10) {
    local_54 = 0x10;
  }
  else {
    local_54 = (in_RDI->rc).best_quality + 4;
  }
  iVar3 = is_scene_change_detected(in_RDI);
  bVar5 = (in_RDI->oxcf).tune_cfg.content != AOM_CONTENT_SCREEN;
  if ((in_RDI->ppi->use_svc != 0) || (bVar5)) {
    local_58 = (in_RDI->rc).frames_since_key;
  }
  else {
    if ((in_RDI->rc).frames_since_key < pCVar2->counter_encode_maxq_scene_change) {
      local_5c = (in_RDI->rc).frames_since_key;
    }
    else {
      local_5c = pCVar2->counter_encode_maxq_scene_change;
    }
    local_58 = local_5c;
  }
  iVar4 = frame_is_intra_only(&in_RDI->common);
  if (((iVar4 != 0) || (iVar3 != 0)) || (((in_RDI->ppi->rtc_ref).bias_recovery_frame & 1U) != 0)) {
    pCVar2->percent_refresh_adjustment = 5;
    pCVar2->rate_ratio_qdelta_adjustment = 0.25;
  }
  pCVar2->skip_over4x4 = (uint)(9 < (in_RDI->oxcf).speed);
  pCVar2->apply_cyclic_refresh = 1;
  iVar4 = frame_is_intra_only(&in_RDI->common);
  if ((((((iVar4 == 0) && (iVar4 = is_lossless_requested(&(in_RDI->oxcf).rc_cfg), iVar4 == 0)) &&
        (((in_RDI->rc).high_motion_content_screen_rtc == 0 &&
         ((iVar3 == 0 && ((in_RDI->svc).temporal_layer_id < 1)))))) &&
       ((in_RDI->svc).prev_number_spatial_layers == (in_RDI->svc).number_spatial_layers)) &&
      (((local_54 <= (pAVar1->p_rc).avg_frame_qindex[1] &&
        (((in_RDI->svc).number_spatial_layers < 2 ||
         ((in_RDI->svc).layer_context[(in_RDI->svc).temporal_layer_id].is_key_frame == 0)))) &&
       ((local_58 < 0x15 || ((pAVar1->p_rc).avg_frame_qindex[1] < 0xec)))))) &&
     (((((in_RDI->rc).avg_frame_low_motion == 0 || (0x1d < (in_RDI->rc).avg_frame_low_motion)) ||
       (local_58 < 0x29)) && (((in_RDI->ppi->rtc_ref).bias_recovery_frame & 1U) == 0)))) {
    if ((in_RDI->svc).number_temporal_layers < 3) {
      pCVar2->percent_refresh = pCVar2->percent_refresh_adjustment + 10;
    }
    else {
      pCVar2->percent_refresh = 0xf;
    }
    if (((in_RDI->active_map).enabled != 0) &&
       (pCVar2->percent_refresh =
             (pCVar2->percent_refresh * (100 - (in_RDI->rc).percent_blocks_inactive)) / 100,
       pCVar2->percent_refresh == 0)) {
      pCVar2->apply_cyclic_refresh = 0;
    }
    pCVar2->max_qdelta_perc = 0x3c;
    pCVar2->time_for_refresh = 0;
    bVar6 = false;
    if ((in_RDI->oxcf).tune_cfg.content != AOM_CONTENT_SCREEN) {
      bVar6 = ((in_RDI->common).seq_params)->sb_size == BLOCK_64X64;
    }
    pCVar2->use_block_sad_scene_det = (uint)bVar6;
    pCVar2->motion_thresh = 0x20;
    iVar3 = 0xf;
    if ((in_RDI->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN) {
      iVar3 = 10;
    }
    pCVar2->rate_boost_fac = iVar3;
    if (pCVar2->percent_refresh < 1) {
      pCVar2->rate_ratio_qdelta = pCVar2->rate_ratio_qdelta_adjustment + 2.25;
    }
    else if ((in_RDI->ppi->use_svc != 0) || (bVar5)) {
      if (local_58 <
          (in_RDI->svc).number_temporal_layers * 4 * (int)(100 / (long)pCVar2->percent_refresh)) {
        pCVar2->rate_ratio_qdelta = pCVar2->rate_ratio_qdelta_adjustment + 3.0;
      }
      else {
        pCVar2->rate_ratio_qdelta = pCVar2->rate_ratio_qdelta_adjustment + 2.25;
      }
    }
    else {
      if ((double)(local_58 / 10) * 0.1 <= 0.75) {
        local_70 = (double)(local_58 / 10) * 0.1;
      }
      else {
        local_70 = 0.75;
      }
      pCVar2->rate_ratio_qdelta = (pCVar2->rate_ratio_qdelta_adjustment + 3.0) - local_70;
      if ((local_58 < 10) && (((in_RDI->rc).rc_1_frame < 0 || ((in_RDI->rc).rc_2_frame < 0)))) {
        pCVar2->rate_ratio_qdelta = pCVar2->rate_ratio_qdelta - 0.25;
      }
    }
    if ((in_RDI->common).width * (in_RDI->common).height < 0x18c01) {
      if ((in_RDI->svc).number_temporal_layers < 2) {
        if ((in_RDI->rc).avg_frame_bandwidth < 3000) {
          pCVar2->motion_thresh = 0x10;
          pCVar2->rate_boost_fac = 0xd;
        }
        else {
          pCVar2->max_qdelta_perc = 0x32;
          if (pCVar2->rate_ratio_qdelta <= 2.0) {
            local_78 = 2.0;
          }
          else {
            local_78 = pCVar2->rate_ratio_qdelta;
          }
          pCVar2->rate_ratio_qdelta = local_78;
        }
      }
      else {
        pCVar2->motion_thresh = 0x20;
        pCVar2->rate_boost_fac = 0xd;
      }
    }
    if ((in_RDI->oxcf).rc_cfg.mode == AOM_VBR) {
      pCVar2->percent_refresh = 10;
      pCVar2->rate_ratio_qdelta = 1.5;
      pCVar2->rate_boost_fac = 10;
      if (((in_RDI->refresh_frame).golden_frame & 1U) != 0) {
        pCVar2->percent_refresh = 0;
        pCVar2->rate_ratio_qdelta = 1.0;
      }
    }
    if ((in_RDI->rc).rtc_external_ratectrl != 0) {
      pCVar2->actual_num_seg1_blocks =
           (pCVar2->percent_refresh * (in_RDI->common).mi_params.mi_rows *
           (in_RDI->common).mi_params.mi_cols) / 100;
      pCVar2->actual_num_seg2_blocks = 0;
    }
  }
  else {
    pCVar2->apply_cyclic_refresh = 0;
  }
  return;
}

Assistant:

void av1_cyclic_refresh_update_parameters(AV1_COMP *const cpi) {
  // TODO(marpan): Parameters need to be tuned.
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const AV1_COMMON *const cm = &cpi->common;
  CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
  SVC *const svc = &cpi->svc;
  const int qp_thresh = AOMMAX(16, rc->best_quality + 4);
  const int qp_max_thresh = 118 * MAXQ >> 7;
  const int scene_change_detected = is_scene_change_detected(cpi);
  const int is_screen_content =
      (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN);

  // A scene change or key frame marks the start of a cyclic refresh cycle.
  const int frames_since_scene_change =
      (cpi->ppi->use_svc || !is_screen_content)
          ? cpi->rc.frames_since_key
          : AOMMIN(cpi->rc.frames_since_key,
                   cr->counter_encode_maxq_scene_change);

  // Cases to reset the cyclic refresh adjustment parameters.
  if (frame_is_intra_only(cm) || scene_change_detected ||
      cpi->ppi->rtc_ref.bias_recovery_frame) {
    // Reset adaptive elements for intra only frames and scene changes.
    cr->percent_refresh_adjustment = 5;
    cr->rate_ratio_qdelta_adjustment = 0.25;
  }

  // Although this segment feature for RTC is only used for
  // blocks >= 8X8, for more efficient coding of the seg map
  // cur_frame->seg_map needs to set at 4x4 along with the
  // function av1_cyclic_reset_segment_skip(). Skipping over
  // 4x4 will therefore have small bdrate loss (~0.2%), so
  // we use it only for speed > 9 for now.
  cr->skip_over4x4 = (cpi->oxcf.speed > 9) ? 1 : 0;

  // should we enable cyclic refresh on this frame.
  cr->apply_cyclic_refresh = 1;
  if (frame_is_intra_only(cm) || is_lossless_requested(&cpi->oxcf.rc_cfg) ||
      cpi->rc.high_motion_content_screen_rtc || scene_change_detected ||
      svc->temporal_layer_id > 0 ||
      svc->prev_number_spatial_layers != svc->number_spatial_layers ||
      p_rc->avg_frame_qindex[INTER_FRAME] < qp_thresh ||
      (svc->number_spatial_layers > 1 &&
       svc->layer_context[svc->temporal_layer_id].is_key_frame) ||
      (frames_since_scene_change > 20 &&
       p_rc->avg_frame_qindex[INTER_FRAME] > qp_max_thresh) ||
      (rc->avg_frame_low_motion && rc->avg_frame_low_motion < 30 &&
       frames_since_scene_change > 40) ||
      cpi->ppi->rtc_ref.bias_recovery_frame) {
    cr->apply_cyclic_refresh = 0;
    return;
  }

  // Increase the amount of refresh for #temporal_layers > 2
  if (svc->number_temporal_layers > 2)
    cr->percent_refresh = 15;
  else
    cr->percent_refresh = 10 + cr->percent_refresh_adjustment;

  if (cpi->active_map.enabled) {
    // Scale down the percent_refresh to target the active blocks only.
    cr->percent_refresh =
        cr->percent_refresh * (100 - cpi->rc.percent_blocks_inactive) / 100;
    if (cr->percent_refresh == 0) {
      cr->apply_cyclic_refresh = 0;
    }
  }

  cr->max_qdelta_perc = 60;
  cr->time_for_refresh = 0;
  cr->use_block_sad_scene_det =
      (cpi->oxcf.tune_cfg.content != AOM_CONTENT_SCREEN &&
       cm->seq_params->sb_size == BLOCK_64X64)
          ? 1
          : 0;
  cr->motion_thresh = 32;
  cr->rate_boost_fac =
      (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN) ? 10 : 15;

  // Use larger delta-qp (increase rate_ratio_qdelta) for first few
  // refresh cycles after a key frame (svc) or scene change (non svc).
  // For non svc screen content, after a scene change gradually reduce
  // this boost and supress it further if either of the previous two
  // frames overshot.
  if (cr->percent_refresh > 0) {
    if (cpi->ppi->use_svc || !is_screen_content) {
      if (frames_since_scene_change <
          ((4 * svc->number_temporal_layers) * (100 / cr->percent_refresh))) {
        cr->rate_ratio_qdelta = 3.0 + cr->rate_ratio_qdelta_adjustment;
      } else {
        cr->rate_ratio_qdelta = 2.25 + cr->rate_ratio_qdelta_adjustment;
      }
    } else {
      double distance_from_sc_factor =
          AOMMIN(0.75, (int)(frames_since_scene_change / 10) * 0.1);
      cr->rate_ratio_qdelta =
          3.0 + cr->rate_ratio_qdelta_adjustment - distance_from_sc_factor;
      if ((frames_since_scene_change < 10) &&
          ((cpi->rc.rc_1_frame < 0) || (cpi->rc.rc_2_frame < 0))) {
        cr->rate_ratio_qdelta -= 0.25;
      }
    }
  } else {
    cr->rate_ratio_qdelta = 2.25 + cr->rate_ratio_qdelta_adjustment;
  }
  // Adjust some parameters for low resolutions.
  if (cm->width * cm->height <= 352 * 288) {
    if (cpi->svc.number_temporal_layers > 1) {
      cr->motion_thresh = 32;
      cr->rate_boost_fac = 13;
    } else {
      if (rc->avg_frame_bandwidth < 3000) {
        cr->motion_thresh = 16;
        cr->rate_boost_fac = 13;
      } else {
        cr->max_qdelta_perc = 50;
        cr->rate_ratio_qdelta = AOMMAX(cr->rate_ratio_qdelta, 2.0);
      }
    }
  }
  if (cpi->oxcf.rc_cfg.mode == AOM_VBR) {
    // To be adjusted for VBR mode, e.g., based on gf period and boost.
    // For now use smaller qp-delta (than CBR), no second boosted seg, and
    // turn-off (no refresh) on golden refresh (since it's already boosted).
    cr->percent_refresh = 10;
    cr->rate_ratio_qdelta = 1.5;
    cr->rate_boost_fac = 10;
    if (cpi->refresh_frame.golden_frame) {
      cr->percent_refresh = 0;
      cr->rate_ratio_qdelta = 1.0;
    }
  }
  if (rc->rtc_external_ratectrl) {
    cr->actual_num_seg1_blocks = cr->percent_refresh * cm->mi_params.mi_rows *
                                 cm->mi_params.mi_cols / 100;
    cr->actual_num_seg2_blocks = 0;
  }
}